

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::ConstructorOp::ConstructorOp
          (ConstructorOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ValueRange *this_00;
  bool bVar1;
  uint uVar2;
  pointer pSVar3;
  pointer pSVar4;
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess other;
  _Alloc_hider _Var5;
  char cVar6;
  Type TVar7;
  VariableType *pVVar8;
  ulong uVar9;
  uint uVar10;
  Scalar *pSVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  pointer pSVar15;
  Scalar *pSVar16;
  pointer pSVar17;
  pointer pcVar18;
  bool bVar19;
  Type inTypes [3];
  ValueRange *local_148;
  _Alloc_hider _Stack_140;
  pointer local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  int local_120;
  VariableType *local_118;
  pointer pMStack_110;
  pointer local_108;
  pointer pMStack_100;
  ValueRange inValueRange;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__ConstructorOp_00c45998;
  this_00 = &this->m_valueRange;
  ValueRange::ValueRange(this_00,valueRange);
  (this->m_inputExpressions).
  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputExpressions).
  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inputValueRanges).super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inputValueRanges).super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inputValueRanges).super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputExpressions).
  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    computeRandomType((VariableType *)&local_148,state,4);
    ValueRange::ValueRange(&inValueRange,(VariableType *)&local_148);
    ValueRange::operator=(this_00,&inValueRange);
    ValueRange::~ValueRange(&inValueRange);
    VariableType::~VariableType((VariableType *)&local_148);
    pSVar16 = (this->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar11 = (this->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pSVar16 ==
        (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSVar16 = (Scalar *)0x0;
    }
    if (pSVar11 ==
        (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSVar11 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min._0_4_ = (int)pSVar16;
    valueRange_00.super_ConstValueRangeAccess.m_type = &this_00->m_type;
    valueRange_00.super_ConstValueRangeAccess.m_min._4_4_ = (int)((ulong)pSVar16 >> 0x20);
    valueRange_00.super_ConstValueRangeAccess.m_max = pSVar11;
    computeRandomValueRange(state,valueRange_00);
  }
  uVar2 = (this->m_valueRange).m_type.m_numElements;
  bVar1 = state->m_programParams->useScalarConversions;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar10 = (this->m_valueRange).m_type.m_baseType - TYPE_FLOAT;
  uVar12 = (ulong)uVar10;
  if (2 < uVar10) {
    uVar12 = 0xffffffffffffffff;
  }
  for (lVar14 = 0; (ulong)uVar2 << 2 != lVar14; lVar14 = lVar14 + 4) {
    pSVar17 = (this->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar3 = (this->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar15 = (this->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar4 = (this->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pVVar8 = VariableType::getElementType(&this_00->m_type);
    _Var5 = inValueRange.m_type.m_typeName._M_dataplus;
    if (pSVar15 == pSVar4) {
      pSVar15 = (pointer)0x0;
    }
    if (pSVar17 == pSVar3) {
      pSVar17 = (pointer)0x0;
    }
    pcVar18 = (pointer)((long)pSVar17 + lVar14);
    pSVar16 = (Scalar *)((long)pSVar15 + lVar14);
    inValueRange.m_type.m_typeName._M_dataplus._M_p._0_4_ = SUB84(pcVar18,0);
    inValueRange.m_type.m_typeName._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar18 >> 0x20);
    if (bVar1 == false) {
      other.m_min._0_4_ = inValueRange.m_type.m_typeName._M_dataplus._M_p._0_4_;
      other.m_type = pVVar8;
      other.m_min._4_4_ = inValueRange.m_type.m_typeName._M_dataplus._M_p._4_4_;
      other.m_max = pSVar16;
      inValueRange.m_type.m_typeName._M_dataplus = _Var5;
      ValueRange::ValueRange(&inValueRange,other);
      std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::emplace_back<rsg::ValueRange>
                (&this->m_inputValueRanges,&inValueRange);
    }
    else {
      inValueRange.m_type._0_8_ = pVVar8;
      inValueRange.m_type.m_typeName._M_dataplus._M_p = pcVar18;
      inValueRange.m_type.m_typeName._M_string_length = (size_type)pSVar16;
      cVar6 = (**(code **)((anonymous_namespace)::
                           isConversionOk(rsg::VariableType::Type,rsg::VariableType::Type,rsg::ConstValueRangeAccess)
                           ::convTable + uVar12 * 8))();
      bVar19 = cVar6 != '\0';
      if (bVar19) {
        inTypes[0] = TYPE_FLOAT;
      }
      inValueRange.m_type._0_8_ = pVVar8;
      inValueRange.m_type.m_typeName._M_dataplus._M_p = pcVar18;
      inValueRange.m_type.m_typeName._M_string_length = (size_type)pSVar16;
      cVar6 = (**(code **)((anonymous_namespace)::
                           isConversionOk(rsg::VariableType::Type,rsg::VariableType::Type,rsg::ConstValueRangeAccess)
                           ::convTable + uVar12 * 8 + 0x18))();
      uVar9 = (ulong)bVar19;
      if (cVar6 != '\0') {
        uVar9 = (ulong)(bVar19 + 1);
        inTypes[bVar19] = TYPE_INT;
      }
      inValueRange.m_type._0_8_ = pVVar8;
      inValueRange.m_type.m_typeName._M_dataplus._M_p = pcVar18;
      inValueRange.m_type.m_typeName._M_string_length = (size_type)pSVar16;
      cVar6 = (**(code **)((anonymous_namespace)::
                           isConversionOk(rsg::VariableType::Type,rsg::VariableType::Type,rsg::ConstValueRangeAccess)
                           ::convTable + uVar12 * 8 + 0x30))();
      uVar13 = uVar9;
      if (cVar6 != '\0') {
        uVar13 = (ulong)((int)uVar9 + 1);
        inTypes[uVar9] = TYPE_BOOL;
      }
      TVar7 = de::Random::choose<rsg::VariableType::Type,rsg::VariableType::Type*>
                        (state->m_random,inTypes,inTypes + uVar13);
      local_148 = (ValueRange *)(ulong)TVar7;
      _Stack_140._M_p = (pointer)&local_130;
      local_138 = (pointer)0x0;
      local_130._M_local_buf[0] = '\0';
      local_120 = 1;
      local_108 = (pointer)0x0;
      pMStack_100 = (pointer)0x0;
      local_118 = (VariableType *)0x0;
      pMStack_110 = (pointer)0x0;
      ValueRange::ValueRange(&inValueRange,(VariableType *)&local_148);
      VariableType::~VariableType((VariableType *)&local_148);
      _Stack_140._M_p = (pointer)(pointer)0x0;
      if (inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start !=
          inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        _Stack_140._M_p =
             (pointer)inValueRange.m_min.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
      }
      local_138 = (pointer)0x0;
      if (inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start !=
          inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_138 = inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar10 = pVVar8->m_baseType - TYPE_FLOAT;
      uVar9 = (ulong)uVar10;
      if (2 < uVar10) {
        uVar9 = 0xffffffffffffffff;
      }
      uVar13 = (ulong)(inValueRange.m_type.m_baseType - TYPE_FLOAT);
      if (2 < inValueRange.m_type.m_baseType - TYPE_FLOAT) {
        uVar13 = 0xffffffffffffffff;
      }
      local_148 = &inValueRange;
      (**(code **)((anonymous_namespace)::
                   convertValueRange(rsg::ConstValueRangeAccess,rsg::ValueRangeAccess)::convTable +
                  uVar13 * 8 + uVar9 * 0x18))();
      std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::push_back
                (&this->m_inputValueRanges,&inValueRange);
    }
    ValueRange::~ValueRange(&inValueRange);
  }
  return;
}

Assistant:

ConstructorOp::ConstructorOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_valueRange(valueRange)
{
	if (valueRange.getType().isVoid())
	{
		// Use random range
		const int maxScalars = 4; // We don't have to be able to assign this value to anywhere
		m_valueRange = ValueRange(computeRandomType(state, maxScalars));
		computeRandomValueRange(state, m_valueRange.asAccess());
	}

	// \todo [2011-03-26 pyry] Vector conversions
//	int						remainingDepth	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();

	const VariableType&		type			= m_valueRange.getType();
	VariableType::Type		baseType		= type.getBaseType();
	int						numScalars		= type.getNumElements();
	int						curScalarNdx	= 0;

	// \todo [2011-03-26 pyry] Separate op for struct constructors!
	DE_ASSERT(type.isFloatOrVec() || type.isIntOrVec() || type.isBoolOrVec());

	bool scalarConversions = state.getProgramParameters().useScalarConversions;

	while (curScalarNdx < numScalars)
	{
		ConstValueRangeAccess comp = m_valueRange.asAccess().component(curScalarNdx);

		if (scalarConversions)
		{
			int					numInTypes = 0;
			VariableType::Type	inTypes[3];

			if (isConversionOk(VariableType::TYPE_FLOAT, baseType, comp))	inTypes[numInTypes++] = VariableType::TYPE_FLOAT;
			if (isConversionOk(VariableType::TYPE_INT, baseType, comp))		inTypes[numInTypes++] = VariableType::TYPE_INT;
			if (isConversionOk(VariableType::TYPE_BOOL, baseType, comp))	inTypes[numInTypes++] = VariableType::TYPE_BOOL;

			DE_ASSERT(numInTypes > 0); // At least nop conversion should be ok

			// Choose random
			VariableType::Type inType = state.getRandom().choose<VariableType::Type>(&inTypes[0], &inTypes[0] + numInTypes);

			// Compute converted value range
			ValueRange inValueRange(VariableType(inType, 1));
			convertValueRange(comp, inValueRange);
			m_inputValueRanges.push_back(inValueRange);

			curScalarNdx += 1;
		}
		else
		{
			m_inputValueRanges.push_back(ValueRange(comp));
			curScalarNdx += 1;
		}
	}
}